

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O1

void __thiscall Cash::save(Cash *this,ofstream *file)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  string local_58;
  string local_38;
  
  lVar1 = *(long *)file;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(file + lVar2 + 0x18) = *(uint *)(file + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(file + *(long *)(lVar1 + -0x18) + 8) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)file,(this->super_Transaction).id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  Transaction::getSenderName_abi_cxx11_(&local_38,&this->super_Transaction);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  Transaction::getReceiverName_abi_cxx11_(&local_58,&this->super_Transaction);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  poVar3 = std::ostream::_M_insert<double>((this->super_Transaction).amount);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Cash::save(ofstream &file) const
{
    file << fixed << setprecision(2) << id << "," << Transaction::getSenderName() << "," << Transaction::getReceiverName() << "," << amount << endl;
}